

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSizeInBytes,size_t inLen,int num_channels,
               EXRChannelInfo *channels,int data_width,int num_lines)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  reference pvVar4;
  unsigned_short *puVar5;
  reference pvVar6;
  PIZChannelData *pPVar7;
  reference data;
  long lVar8;
  size_t n;
  PIZChannelData *cd_1;
  size_t i_2;
  int y;
  int j;
  PIZChannelData *cd;
  size_t i_1;
  size_t pixelSize;
  EXRChannelInfo *chan;
  size_t i;
  unsigned_short *tmpBufferEnd;
  undefined1 local_d0 [8];
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  undefined1 local_b0 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  int length;
  unsigned_short maxValue;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lut;
  uchar *ptr;
  size_t readLen;
  ushort local_5e;
  ushort local_5c;
  allocator<unsigned_char> local_59;
  undefined1 local_58 [2];
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  EXRChannelInfo *channels_local;
  int num_channels_local;
  size_t inLen_local;
  size_t tmpBufSizeInBytes_local;
  uchar *inPtr_local;
  uchar *outPtr_local;
  
  bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)channels;
  if (inLen == tmpBufSizeInBytes) {
    memcpy(outPtr,inPtr,inLen);
    return true;
  }
  std::allocator<unsigned_char>::allocator(&local_59);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0x2000,&local_59);
  std::allocator<unsigned_char>::~allocator(&local_59);
  puVar3 = tinyusdz::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  memset(puVar3,0,0x2000);
  if (inLen < 4) {
    outPtr_local._7_1_ = false;
  }
  else {
    lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)inPtr;
    cpy2(&local_5c,(unsigned_short *)inPtr);
    cpy2(&local_5e,
         lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 1);
    lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 2;
    ptr = (uchar *)0x4;
    if (local_5e < 0x2000) {
      if (local_5e < local_5c) {
        if ((local_5c != 0x1fff) || (local_5e != 0)) {
          outPtr_local._7_1_ = false;
          goto LAB_0099f98f;
        }
      }
      else {
        if (inLen < (long)(int)(((uint)local_5e - (uint)local_5c) + 1) + 4U) {
          outPtr_local._7_1_ = false;
          goto LAB_0099f98f;
        }
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
        memcpy(pvVar4 + (int)(uint)local_5c,
               lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (long)(int)(((uint)local_5e - (uint)local_5c) + 1));
        lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      (long)(int)(((uint)local_5e - (uint)local_5c) + 1));
        ptr = (uchar *)((long)(int)(((uint)local_5e - (uint)local_5c) + 1) + 4);
      }
      std::allocator<unsigned_short>::allocator
                ((allocator<unsigned_short> *)
                 ((long)&tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&length,0x10000,
                 (allocator_type *)
                 ((long)&tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<unsigned_short>::~allocator
                ((allocator<unsigned_short> *)
                 ((long)&tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 7));
      puVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&length);
      memset(puVar5,0,0x20000);
      puVar3 = tinyusdz::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
      puVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&length);
      tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_2_ = reverseLutFromBitmap(puVar3,puVar5);
      if (inLen < ptr + 4) {
        outPtr_local._7_1_ = false;
      }
      else {
        tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        cpy4((int *)&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
             (int *)lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 2;
        if (inLen < (ulong)((long)lut.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage +
                           ((long)(int)tmpBuffer.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)inPtr))) {
          outPtr_local._7_1_ = false;
        }
        else {
          std::allocator<unsigned_short>::allocator
                    ((allocator<unsigned_short> *)
                     ((long)&channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                     tmpBufSizeInBytes >> 1,
                     (allocator_type *)
                     ((long)&channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::allocator<unsigned_short>::~allocator
                    ((allocator<unsigned_short> *)
                     ((long)&channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          hufUncompress((char *)lut.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (int)tmpBuffer.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0);
          std::allocator<tinyexr::PIZChannelData>::allocator
                    ((allocator<tinyexr::PIZChannelData> *)((long)&tmpBufferEnd + 7));
          std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
                    ((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
                     local_d0,(long)num_channels,(allocator_type *)((long)&tmpBufferEnd + 7));
          std::allocator<tinyexr::PIZChannelData>::~allocator
                    ((allocator<tinyexr::PIZChannelData> *)((long)&tmpBufferEnd + 7));
          i = (size_t)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0
                                 ,0);
          for (chan = (EXRChannelInfo *)0x0; chan < (EXRChannelInfo *)(long)num_channels;
              chan = (EXRChannelInfo *)(chan->name + 1)) {
            i_1 = 4;
            if (*(int *)(bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage +
                        (long)chan * 0x110 + 0x100) == 1) {
              i_1 = 2;
            }
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            pvVar6->start = (unsigned_short *)i;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            puVar5 = pvVar6->start;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            pvVar6->end = puVar5;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            pvVar6->nx = data_width;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            pvVar6->ny = num_lines;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            pvVar6->size = (int)(i_1 >> 1);
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            iVar1 = pvVar6->nx;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            iVar2 = pvVar6->ny;
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)chan);
            i = i + (long)(iVar1 * iVar2 * pvVar6->size) * 2;
          }
          for (cd = (PIZChannelData *)0x0;
              pPVar7 = (PIZChannelData *)
                       std::
                       vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                       size((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             *)local_d0), cd < pPVar7; cd = (PIZChannelData *)((long)&cd->start + 1)
              ) {
            pvVar6 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ::operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)cd);
            for (i_2._4_4_ = 0; i_2._4_4_ < pvVar6->size; i_2._4_4_ = i_2._4_4_ + 1) {
              wav2Decode(pvVar6->start + i_2._4_4_,pvVar6->nx,pvVar6->size,pvVar6->ny,
                         pvVar6->nx * pvVar6->size,
                         tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_2_);
            }
          }
          puVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&length);
          data = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,0);
          applyLut(puVar5,data,(int)(tmpBufSizeInBytes >> 1));
          inPtr_local = outPtr;
          for (i_2._0_4_ = 0; (int)i_2 < num_lines; i_2._0_4_ = (int)i_2 + 1) {
            for (cd_1 = (PIZChannelData *)0x0;
                pPVar7 = (PIZChannelData *)
                         std::
                         vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                         size((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                               *)local_d0), cd_1 < pPVar7;
                cd_1 = (PIZChannelData *)((long)&cd_1->start + 1)) {
              pvVar6 = std::
                       vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                       operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   *)local_d0,(size_type)cd_1);
              lVar8 = (long)(pvVar6->nx * pvVar6->size);
              memcpy(inPtr_local,pvVar6->end,lVar8 << 1);
              inPtr_local = inPtr_local + lVar8 * 2;
              pvVar6->end = pvVar6->end + lVar8;
            }
          }
          outPtr_local._7_1_ = true;
          std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::~vector
                    ((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
                     local_d0);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0);
        }
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&length);
    }
    else {
      outPtr_local._7_1_ = false;
    }
  }
LAB_0099f98f:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return outPtr_local._7_1_;
}

Assistant:

static bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr,
                          size_t tmpBufSizeInBytes, size_t inLen, int num_channels,
                          const EXRChannelInfo *channels, int data_width,
                          int num_lines) {
  if (inLen == tmpBufSizeInBytes) {
    // Data is not compressed(Issue 40).
    memcpy(outPtr, inPtr, inLen);
    return true;
  }

  std::vector<unsigned char> bitmap(BITMAP_SIZE);
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !TINYEXR_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  return false;
#endif

  memset(bitmap.data(), 0, BITMAP_SIZE);

  if (inLen < 4) {
    return false;
  }

  size_t readLen = 0;

  const unsigned char *ptr = inPtr;
  // minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  tinyexr::cpy2(&minNonZero, reinterpret_cast<const unsigned short *>(ptr));
  // maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  tinyexr::cpy2(&maxNonZero, reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;
  readLen += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  //printf("maxNonZero = %d\n", maxNonZero);
  //printf("minNonZero = %d\n", minNonZero);
  //printf("len = %d\n", (maxNonZero - minNonZero + 1));
  //printf("BITMAPSIZE - min = %d\n", (BITMAP_SIZE - minNonZero));

  if (minNonZero <= maxNonZero) {
    if (((maxNonZero - minNonZero + 1) + readLen) > inLen) {
      // Input too short
      return false;
    }

    memcpy(reinterpret_cast<char *>(&bitmap[0] + minNonZero), ptr,
           maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
    readLen += maxNonZero - minNonZero + 1;
  } else {
    // Issue 194
    if ((minNonZero == (BITMAP_SIZE - 1)) && (maxNonZero == 0)) {
      // OK. all pixels are zero. And no need to read `bitmap` data.
    } else {
      // invalid minNonZero/maxNonZero combination.
      return false;
    }
  }

  std::vector<unsigned short> lut(USHORT_RANGE);
  memset(lut.data(), 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap.data(), lut.data());

  //
  // Huffman decoding
  //

  if ((readLen + 4) > inLen) {
    return false;
  }

  int length=0;

  // length = *(reinterpret_cast<const int *>(ptr));
  tinyexr::cpy4(&length, reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  if (size_t((ptr - inPtr) + length) > inLen) {
    return false;
  }

  std::vector<unsigned short> tmpBuffer(tmpBufSizeInBytes / sizeof(unsigned short));
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(static_cast<size_t>(num_channels));

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < static_cast<size_t>(num_channels); ++i) {
    const EXRChannelInfo &chan = channels[i];

    size_t pixelSize = sizeof(int);  // UINT and FLOAT
    if (chan.pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = data_width;
    channelData[i].ny = num_lines;
    // channelData[i].ys = 1;
    channelData[i].size = static_cast<int>(pixelSize / sizeof(short));

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut.data(), &tmpBuffer.at(0), static_cast<int>(tmpBufSizeInBytes / sizeof(unsigned short)));

  for (int y = 0; y < num_lines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      size_t n = static_cast<size_t>(cd.nx * cd.size);
      memcpy(outPtr, cd.end, static_cast<size_t>(n * sizeof(unsigned short)));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}